

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_selection_ivec3(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_3> local_70;
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  _anonymous_namespace_ local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)local_10 + 0x40,1,2);
  tcu::Vector<float,_3>::asInt((Vector<float,_3> *)(local_40 + 0xc));
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_58,(int)local_10 + 0x50,3,1);
  tcu::Vector<float,_3>::asInt((Vector<float,_3> *)(local_58 + 0xc));
  sr::(anonymous_namespace)::selection<tcu::Vector<int,3>>
            (local_28,0.0 < fVar1,(Vector<int,_3> *)(local_40 + 0xc),
             (Vector<int,_3> *)(local_58 + 0xc));
  tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&local_1c);
  tcu::Vector<float,_4>::xyz(&local_70,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_1c);
  return;
}

Assistant:

void eval_selection_ivec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 2, 0).asInt(),		c.in[2].swizzle(3, 1, 2).asInt()).asFloat(); }